

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

int createEventfd(void)

{
  int iVar1;
  Logger local_fe8;
  
  iVar1 = eventfd(0,0x80800);
  if (-1 < iVar1) {
    return iVar1;
  }
  Logger::Logger(&local_fe8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                 ,0xd);
  LogStream::operator<<((LogStream *)&local_fe8,"Error: Failed in eventfd");
  Logger::~Logger(&local_fe8);
  abort();
}

Assistant:

int createEventfd() {
    int evtfd = eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
    if (evtfd < 0) {
        LOG << "Error: Failed in eventfd";
        abort();
    }

    return evtfd;
}